

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textures.c
# Opt level: O1

Image * LoadImageAnim(Image *__return_storage_ptr__,char *fileName,int *frames)

{
  _Bool _Var1;
  uchar *buffer;
  stbi_uc *psVar2;
  int framesCount;
  uint dataSize;
  int comp;
  
  __return_storage_ptr__->data = (void *)0x0;
  __return_storage_ptr__->width = 0;
  __return_storage_ptr__->height = 0;
  __return_storage_ptr__->mipmaps = 0;
  __return_storage_ptr__->format = 0;
  framesCount = 1;
  _Var1 = IsFileExtension(fileName,".gif");
  if (_Var1) {
    dataSize = 0;
    buffer = LoadFileData(fileName,&dataSize);
    if (buffer != (uchar *)0x0) {
      comp = 0;
      psVar2 = stbi_load_gif_from_memory
                         (buffer,dataSize,(int **)0x0,&__return_storage_ptr__->width,
                          &__return_storage_ptr__->height,&framesCount,&comp,4);
      __return_storage_ptr__->data = psVar2;
      __return_storage_ptr__->mipmaps = 1;
      __return_storage_ptr__->format = 7;
      free(buffer);
    }
  }
  else {
    LoadImage(__return_storage_ptr__,fileName);
  }
  *frames = framesCount;
  return __return_storage_ptr__;
}

Assistant:

Image LoadImageAnim(const char *fileName, int *frames)
{
    Image image = { 0 };
    int framesCount = 1;

#if defined(SUPPORT_FILEFORMAT_GIF)
    if (IsFileExtension(fileName, ".gif"))
    {
        unsigned int dataSize = 0;
        unsigned char *fileData = LoadFileData(fileName, &dataSize);

        if (fileData != NULL)
        {
            int comp = 0;
            int **delays = NULL;
            image.data = stbi_load_gif_from_memory(fileData, dataSize, delays, &image.width, &image.height, &framesCount, &comp, 4);

            image.mipmaps = 1;
            image.format = PIXELFORMAT_UNCOMPRESSED_R8G8B8A8;

            RL_FREE(fileData);
            RL_FREE(delays);        // NOTE: Frames delays are discarded
        }
    }
#else
    if (false) { }
#endif
    else image = LoadImage(fileName);

    // TODO: Support APNG animated images?

    *frames = framesCount;
    return image;
}